

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O1

int64 TTD::NSLogEvents::AccessTimeInRootCallOrSnapshot
                (EventLogEntry *evt,bool *isSnap,bool *isRoot,bool *hasRtrSnap)

{
  int64 iVar1;
  EventLogEntry *pEVar2;
  bool bVar3;
  
  *isSnap = false;
  *isRoot = false;
  *hasRtrSnap = false;
  if (evt->EventKind == SnapshotTag) {
    pEVar2 = evt + 1;
    *isSnap = true;
  }
  else {
    if ((evt->EventKind != CallExistingFunctionActionTag) || ((int)evt[1].EventTimeStamp != 0)) {
      return -1;
    }
    *isRoot = true;
    if ((long *)evt[3].EventTimeStamp == (long *)0x0) {
      bVar3 = false;
    }
    else {
      bVar3 = *(long *)evt[3].EventTimeStamp != 0;
    }
    *hasRtrSnap = bVar3;
    pEVar2 = (EventLogEntry *)&evt[2].EventTimeStamp;
  }
  iVar1._0_4_ = pEVar2->EventKind;
  iVar1._4_4_ = pEVar2->ResultStatus;
  return iVar1;
}

Assistant:

int64 AccessTimeInRootCallOrSnapshot(const EventLogEntry* evt, bool& isSnap, bool& isRoot, bool& hasRtrSnap)
        {
            isSnap = false;
            isRoot = false;
            hasRtrSnap = false;

            if(evt->EventKind == NSLogEvents::EventKind::SnapshotTag)
            {
                const NSLogEvents::SnapshotEventLogEntry* snapEvent = NSLogEvents::GetInlineEventDataAs<NSLogEvents::SnapshotEventLogEntry, NSLogEvents::EventKind::SnapshotTag>(evt);

                isSnap = true;
                return snapEvent->RestoreTimestamp;
            }
            else if(NSLogEvents::IsJsRTActionRootCall(evt))
            {
                const NSLogEvents::JsRTCallFunctionAction* rootEntry = NSLogEvents::GetInlineEventDataAs<NSLogEvents::JsRTCallFunctionAction, NSLogEvents::EventKind::CallExistingFunctionActionTag>(evt);

                isRoot = true;
                hasRtrSnap = (rootEntry->AdditionalReplayInfo != nullptr && rootEntry->AdditionalReplayInfo->RtRSnap != nullptr);
                return rootEntry->CallEventTime;
            }
            else
            {
                return -1;
            }
        }